

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.hpp
# Opt level: O0

void __thiscall true_node::exec(true_node *this,test_agent_proxy *ap,test_handler *hdl)

{
  test_handler *ap_00;
  agent_type *this_00;
  function<void_(bool,_test_agent_*)> local_40;
  test_handler *local_20;
  test_handler *hdl_local;
  test_agent_proxy *ap_local;
  true_node *this_local;
  
  local_20 = hdl;
  hdl_local = (test_handler *)ap;
  ap_local = (test_agent_proxy *)this;
  this_00 = ranger::bhvr_tree::
            agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
            ::operator->(ap);
  test_agent::increase_true_counter(this_00);
  ap_00 = hdl_local;
  std::function<void_(bool,_test_agent_*)>::function(&local_40,hdl);
  behavior_node<true>::exec(&this->super_behavior_node<true>,(test_agent_proxy *)ap_00,&local_40);
  std::function<void_(bool,_test_agent_*)>::~function(&local_40);
  return;
}

Assistant:

void exec(test_agent_proxy& ap, test_handler hdl) const final {
    ap->increase_true_counter();
    behavior_node<true>::exec(ap, std::move(hdl));
  }